

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsview.cpp
# Opt level: O1

void QGraphicsView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qreal *pqVar1;
  qreal qVar2;
  QBrush *brush;
  qreal qVar3;
  qreal qVar4;
  undefined4 uVar5;
  undefined8 *puVar6;
  int iVar7;
  InterfaceType *pIVar8;
  QFlagsStorage<QGraphicsScene::SceneLayer> layers;
  QRectF *rect;
  long lVar9;
  QGraphicsViewPrivate *pQVar10;
  long in_FS_OFFSET;
  QRectF local_58;
  long local_38;
  
  rect = &local_58;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    rubberBandChanged((QGraphicsView *)_o,*(QRect *)_a[1],*(QPointF *)_a[2],*(QPointF *)_a[3]);
    break;
  case 1:
    updateScene((QGraphicsView *)_o,(QList<QRectF> *)_a[1]);
    break;
  case 2:
    rect = (QRectF *)_a[1];
    layers.i = *_a[2];
    goto LAB_006460c9;
  case 3:
    rect = (QRectF *)_a[1];
    goto LAB_006460c1;
  case 4:
    local_58.w = 0.0;
    local_58.h = 0.0;
    local_58.xp = 0.0;
    local_58.yp = 0.0;
LAB_006460c1:
    layers.i = 0xffff;
LAB_006460c9:
    invalidateScene((QGraphicsView *)_o,rect,(SceneLayers)layers.i);
    break;
  case 5:
    pQVar10 = *(QGraphicsViewPrivate **)(_o + 8);
    if ((pQVar10->field_0x300 & 2) == 0) {
      pqVar1 = (qreal *)_a[1];
      qVar2 = *pqVar1;
      qVar3 = pqVar1[1];
      qVar4 = pqVar1[3];
      (pQVar10->sceneRect).w = pqVar1[2];
      (pQVar10->sceneRect).h = qVar4;
      (pQVar10->sceneRect).xp = qVar2;
      (pQVar10->sceneRect).yp = qVar3;
      QGraphicsViewPrivate::recalculateContentSize(pQVar10);
    }
    break;
  case 6:
    (**(code **)(*(long *)_o + 0x1a8))(_o,*_a[1]);
    break;
  case 7:
    QGraphicsViewPrivate::_q_setViewportCursor(*(QGraphicsViewPrivate **)(_o + 8),(QCursor *)_a[1]);
    break;
  case 8:
    QGraphicsViewPrivate::_q_unsetViewportCursor(*(QGraphicsViewPrivate **)(_o + 8));
  }
  switch(_c) {
  case ReadProperty:
switchD_0064604e_caseD_1:
    if (0xc < (uint)_id) goto LAB_006462f9;
    pqVar1 = (qreal *)*_a;
    switch(_id) {
    case 0:
      lVar9 = 0x4e0;
      goto LAB_0064629e;
    case 1:
      lVar9 = 0x4e8;
LAB_0064629e:
      QBrush::QBrush((QBrush *)&local_58,(QBrush *)(lVar9 + *(long *)(_o + 8)));
      qVar2 = *pqVar1;
      *pqVar1 = local_58.xp;
      local_58.xp = qVar2;
      QBrush::~QBrush((QBrush *)&local_58);
      goto LAB_006462f9;
    case 2:
      *(byte *)pqVar1 = *(byte *)(*(long *)(_o + 8) + 0x300) & 1;
      goto LAB_006462f9;
    case 3:
      sceneRect(&local_58,(QGraphicsView *)_o);
      pqVar1[2] = local_58.w;
      pqVar1[3] = local_58.h;
      *pqVar1 = local_58.xp;
      pqVar1[1] = local_58.yp;
      goto LAB_006462f9;
    case 4:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x478);
      break;
    case 5:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x2f8);
      break;
    case 6:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x2fc);
      break;
    case 7:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x4c0);
      break;
    case 8:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x47c);
      break;
    case 9:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x480);
      break;
    case 10:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x484);
      break;
    case 0xb:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x4b4);
      break;
    case 0xc:
      uVar5 = *(undefined4 *)(*(long *)(_o + 8) + 0x488);
    }
    *(undefined4 *)pqVar1 = uVar5;
LAB_006462f9:
    if (_c != WriteProperty) goto switchD_0064604e_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_0064604e_caseD_3;
  case IndexOfMethod:
switchD_0064604e_caseD_5:
    if ((*_a[1] == rubberBandChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_0064604e_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_0064604e_caseD_3;
      goto switchD_0064604e_caseD_1;
    }
    break;
  case RegisterMethodArgumentMetaType:
    if (_id == 1) {
      puVar6 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_00646192;
      pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QRectF>_>::metaType;
LAB_0064618a:
      *puVar6 = pIVar8;
    }
    else {
      if (_id == 6) {
        puVar6 = (undefined8 *)*_a;
        if (*_a[1] == 0) {
          pIVar8 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
          goto LAB_0064618a;
        }
      }
      else {
        puVar6 = (undefined8 *)*_a;
      }
LAB_00646192:
      *puVar6 = 0;
    }
    if (_c == ReadProperty) goto switchD_0064604e_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_0064604e_caseD_3;
      goto switchD_0064604e_caseD_5;
    }
  }
  if (0xc < (uint)_id) goto switchD_0064604e_caseD_3;
  brush = (QBrush *)*_a;
  switch(_id) {
  case 0:
    setBackgroundBrush((QGraphicsView *)_o,brush);
    break;
  case 1:
    setForegroundBrush((QGraphicsView *)_o,brush);
    break;
  case 2:
    *(uint *)(*(long *)(_o + 8) + 0x300) =
         *(uint *)(*(long *)(_o + 8) + 0x300) & 0xfffffffe | (uint)(byte)*brush;
    break;
  case 3:
    pQVar10 = *(QGraphicsViewPrivate **)(_o + 8);
    *(uint *)&pQVar10->field_0x300 =
         (*(uint *)&pQVar10->field_0x300 & 0xfffffffd) +
         ((byte)~(-(*(double *)(brush + 0x18) == 0.0) & -(*(double *)(brush + 0x10) == 0.0)) & 1) *
         2;
    qVar2 = *(qreal *)(brush + 8);
    qVar3 = *(qreal *)(brush + 0x10);
    qVar4 = *(qreal *)(brush + 0x18);
    (pQVar10->sceneRect).xp = *(qreal *)brush;
    (pQVar10->sceneRect).yp = qVar2;
    (pQVar10->sceneRect).w = qVar3;
    (pQVar10->sceneRect).h = qVar4;
    goto LAB_006463f1;
  case 4:
    pQVar10 = *(QGraphicsViewPrivate **)(_o + 8);
    if ((pQVar10->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
        super_QFlagsStorage<Qt::AlignmentFlag>.i == *(Int *)brush) break;
    (pQVar10->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = *(Int *)brush;
LAB_006463f1:
    QGraphicsViewPrivate::recalculateContentSize(pQVar10);
    break;
  case 5:
    setRenderHints((QGraphicsView *)_o,
                   (QFlagsStorageHelper<QPainter::RenderHint,_4>)
                   *(QFlagsStorageHelper<QPainter::RenderHint,_4> *)brush);
    break;
  case 6:
    setDragMode((QGraphicsView *)_o,*(DragMode *)brush);
    break;
  case 7:
    if (*(int *)(*(long *)(_o + 8) + 0x4c0) != *(int *)brush) {
      *(int *)(*(long *)(_o + 8) + 0x4c0) = *(int *)brush;
      resetCachedContent((QGraphicsView *)_o);
    }
    break;
  case 8:
    iVar7 = *(int *)brush;
    lVar9 = *(long *)(_o + 8);
    *(int *)(lVar9 + 0x47c) = iVar7;
    goto LAB_00646452;
  case 9:
    iVar7 = *(int *)brush;
    lVar9 = *(long *)(_o + 8);
    *(int *)(lVar9 + 0x480) = iVar7;
LAB_00646452:
    if (iVar7 == 2) {
      QWidget::setAttribute(*(QWidget **)(lVar9 + 0x2b0),WA_MouseTracking,true);
    }
    break;
  case 10:
    *(undefined4 *)(*(long *)(_o + 8) + 0x484) = *(undefined4 *)brush;
    break;
  case 0xb:
    *(undefined4 *)(*(long *)(_o + 8) + 0x4b4) = *(undefined4 *)brush;
    break;
  case 0xc:
    *(undefined4 *)(*(long *)(_o + 8) + 0x488) = *(undefined4 *)brush;
  }
switchD_0064604e_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rubberBandChanged((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QPointF>>(_a[3]))); break;
        case 1: _t->updateScene((*reinterpret_cast< std::add_pointer_t<QList<QRectF>>>(_a[1]))); break;
        case 2: _t->invalidateScene((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QGraphicsScene::SceneLayers>>(_a[2]))); break;
        case 3: _t->invalidateScene((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 4: _t->invalidateScene(); break;
        case 5: _t->updateSceneRect((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 6: _t->setupViewport((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 7: _t->d_func()->_q_setViewportCursor((*reinterpret_cast< std::add_pointer_t<QCursor>>(_a[1]))); break;
        case 8: _t->d_func()->_q_unsetViewportCursor(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QRectF> >(); break;
            }
            break;
        case 6:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsView::*)(QRect , QPointF , QPointF )>(_a, &QGraphicsView::rubberBandChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QBrush*>(_v) = _t->backgroundBrush(); break;
        case 1: *reinterpret_cast<QBrush*>(_v) = _t->foregroundBrush(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isInteractive(); break;
        case 3: *reinterpret_cast<QRectF*>(_v) = _t->sceneRect(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: QtMocHelpers::assignFlags<QPainter::RenderHints>(_v, _t->renderHints()); break;
        case 6: *reinterpret_cast<DragMode*>(_v) = _t->dragMode(); break;
        case 7: QtMocHelpers::assignFlags<CacheMode>(_v, _t->cacheMode()); break;
        case 8: *reinterpret_cast<ViewportAnchor*>(_v) = _t->transformationAnchor(); break;
        case 9: *reinterpret_cast<ViewportAnchor*>(_v) = _t->resizeAnchor(); break;
        case 10: *reinterpret_cast<ViewportUpdateMode*>(_v) = _t->viewportUpdateMode(); break;
        case 11: *reinterpret_cast<Qt::ItemSelectionMode*>(_v) = _t->rubberBandSelectionMode(); break;
        case 12: QtMocHelpers::assignFlags<OptimizationFlags>(_v, _t->optimizationFlags()); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setBackgroundBrush(*reinterpret_cast<QBrush*>(_v)); break;
        case 1: _t->setForegroundBrush(*reinterpret_cast<QBrush*>(_v)); break;
        case 2: _t->setInteractive(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setSceneRect(*reinterpret_cast<QRectF*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setRenderHints(*reinterpret_cast<QPainter::RenderHints*>(_v)); break;
        case 6: _t->setDragMode(*reinterpret_cast<DragMode*>(_v)); break;
        case 7: _t->setCacheMode(*reinterpret_cast<CacheMode*>(_v)); break;
        case 8: _t->setTransformationAnchor(*reinterpret_cast<ViewportAnchor*>(_v)); break;
        case 9: _t->setResizeAnchor(*reinterpret_cast<ViewportAnchor*>(_v)); break;
        case 10: _t->setViewportUpdateMode(*reinterpret_cast<ViewportUpdateMode*>(_v)); break;
        case 11: _t->setRubberBandSelectionMode(*reinterpret_cast<Qt::ItemSelectionMode*>(_v)); break;
        case 12: _t->setOptimizationFlags(*reinterpret_cast<OptimizationFlags*>(_v)); break;
        default: break;
        }
    }
}